

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abc.c
# Opt level: O3

int Abc_CommandPrintLevel(Abc_Frame_t *pAbc,int argc,char **argv)

{
  int iVar1;
  uint uVar2;
  Abc_Ntk_t *pNtk;
  Abc_Obj_t *pNode;
  char *pcVar3;
  uint fVerbose;
  uint fProfile;
  char *pcVar4;
  uint fListNodes;
  
  pNtk = Abc_FrameReadNtk(pAbc);
  fVerbose = 0;
  Extra_UtilGetoptReset();
  iVar1 = Extra_UtilGetopt(argc,argv,"npvh");
  if (iVar1 == -1) {
    if (pNtk != (Abc_Ntk_t *)0x0) {
      fProfile = 1;
      fListNodes = 0;
      fVerbose = 0;
      goto LAB_0024bdb6;
    }
LAB_0024be8a:
    pcVar3 = "Empty network.\n";
  }
  else {
    fProfile = 1;
    fListNodes = 0;
    do {
      uVar2 = iVar1 - 0x68U >> 1 | (uint)((iVar1 - 0x68U & 1) != 0) << 0x1f;
      if (uVar2 == 7) {
        fVerbose = fVerbose ^ 1;
      }
      else if (uVar2 == 4) {
        fProfile = fProfile ^ 1;
      }
      else {
        if (uVar2 != 3) goto LAB_0024bde0;
        fListNodes = fListNodes ^ 1;
      }
      iVar1 = Extra_UtilGetopt(argc,argv,"npvh");
    } while (iVar1 != -1);
    if (pNtk == (Abc_Ntk_t *)0x0) goto LAB_0024be8a;
    if (fProfile != 0) {
LAB_0024bdb6:
      if (argc <= globalUtilOptind + 1) {
        if (globalUtilOptind + 1 != argc) {
          Abc_NtkPrintLevel(_stdout,pNtk,fProfile,fListNodes,fVerbose);
          return 0;
        }
        pNode = Abc_NtkFindNode(pNtk,argv[globalUtilOptind]);
        if (pNode == (Abc_Obj_t *)0x0) {
          Abc_Print(-1,"Cannot find node \"%s\".\n",argv[globalUtilOptind]);
          return 1;
        }
        Abc_NodePrintLevel(_stdout,pNode);
        return 0;
      }
      Abc_Print(-1,"Wrong number of auguments.\n");
LAB_0024bde0:
      Abc_Print(-2,"usage: print_level [-npvh] <node>\n");
      Abc_Print(-2,"\t        prints information about node level and cone size\n");
      pcVar4 = "yes";
      pcVar3 = "yes";
      if (fListNodes == 0) {
        pcVar3 = "no";
      }
      Abc_Print(-2,"\t-n    : toggles printing nodes by levels [default = %s]\n",pcVar3);
      pcVar3 = "yes";
      if (fProfile == 0) {
        pcVar3 = "no";
      }
      Abc_Print(-2,"\t-p    : toggles printing level profile [default = %s]\n",pcVar3);
      if (fVerbose == 0) {
        pcVar4 = "no";
      }
      Abc_Print(-2,"\t-v    : enable verbose output [default = %s].\n",pcVar4);
      Abc_Print(-2,"\t-h    : print the command usage\n");
      pcVar3 = "\tnode  : (optional) one node to consider\n";
      iVar1 = -2;
      goto LAB_0024be96;
    }
    if (pNtk->ntkType == ABC_NTK_STRASH) {
      fProfile = 0;
      goto LAB_0024bdb6;
    }
    pcVar3 = "This command works only for AIGs (run \"strash\").\n";
  }
  iVar1 = -1;
LAB_0024be96:
  Abc_Print(iVar1,pcVar3);
  return 1;
}

Assistant:

int Abc_CommandPrintLevel( Abc_Frame_t * pAbc, int argc, char ** argv )
{
    Abc_Ntk_t * pNtk = Abc_FrameReadNtk(pAbc);
    Abc_Obj_t * pNode;
    int c;
    int fListNodes;
    int fProfile;
    int fVerbose;

    // set defaults
    fListNodes = 0;
    fProfile   = 1;
    fVerbose   = 0;
    Extra_UtilGetoptReset();
    while ( ( c = Extra_UtilGetopt( argc, argv, "npvh" ) ) != EOF )
    {
        switch ( c )
        {
        case 'n':
            fListNodes ^= 1;
            break;
        case 'p':
            fProfile ^= 1;
            break;
        case 'v':
            fVerbose ^= 1;
            break;
        case 'h':
            goto usage;
        default:
            goto usage;
        }
    }

    if ( pNtk == NULL )
    {
        Abc_Print( -1, "Empty network.\n" );
        return 1;
    }

    if ( !fProfile && !Abc_NtkIsStrash(pNtk) )
    {
        Abc_Print( -1, "This command works only for AIGs (run \"strash\").\n" );
        return 1;
    }

    if ( argc > globalUtilOptind + 1 )
    {
        Abc_Print( -1, "Wrong number of auguments.\n" );
        goto usage;
    }

    if ( argc == globalUtilOptind + 1 )
    {
        pNode = Abc_NtkFindNode( pNtk, argv[globalUtilOptind] );
        if ( pNode == NULL )
        {
            Abc_Print( -1, "Cannot find node \"%s\".\n", argv[globalUtilOptind] );
            return 1;
        }
        Abc_NodePrintLevel( stdout, pNode );
        return 0;
    }
    // process all COs
    Abc_NtkPrintLevel( stdout, pNtk, fProfile, fListNodes, fVerbose );
    return 0;

usage:
    Abc_Print( -2, "usage: print_level [-npvh] <node>\n" );
    Abc_Print( -2, "\t        prints information about node level and cone size\n" );
    Abc_Print( -2, "\t-n    : toggles printing nodes by levels [default = %s]\n", fListNodes? "yes": "no" );
    Abc_Print( -2, "\t-p    : toggles printing level profile [default = %s]\n", fProfile? "yes": "no" );
    Abc_Print( -2, "\t-v    : enable verbose output [default = %s].\n", fVerbose? "yes": "no" );
    Abc_Print( -2, "\t-h    : print the command usage\n");
    Abc_Print( -2, "\tnode  : (optional) one node to consider\n");
    return 1;
}